

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Parameters params_local;
  string local_138;
  RefBase<vk::VkCommandBuffer_s_*> local_118;
  RefBase<vk::VkCommandBuffer_s_*> local_f8;
  Resources res;
  RefBase<vk::VkCommandBuffer_s_*> local_a8;
  Environment env;
  RefBase<vk::VkCommandBuffer_s_*> local_48;
  
  params_local = params;
  Environment::Environment(&env,context,4);
  CommandBuffer::Resources::Resources(&res,&env,&params_local);
  CommandBuffer::create((Move<vk::VkCommandBuffer_s_*> *)&local_118,&env,&res,&params_local);
  local_138.field_2._M_allocated_capacity = (size_type)local_118.m_data.deleter.m_device;
  local_138.field_2._8_8_ = local_118.m_data.deleter.m_pool.m_internal;
  local_138._M_dataplus._M_p = (pointer)local_118.m_data.object;
  local_138._M_string_length = (size_type)local_118.m_data.deleter.m_deviceIface;
  local_118.m_data.object = (VkCommandBuffer_s *)0x0;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_118.m_data.deleter.m_device = (VkDevice)0x0;
  local_118.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_118);
  CommandBuffer::create((Move<vk::VkCommandBuffer_s_*> *)&local_f8,&env,&res,&params_local);
  local_118.m_data.deleter.m_device = local_f8.m_data.deleter.m_device;
  local_118.m_data.deleter.m_pool.m_internal = local_f8.m_data.deleter.m_pool.m_internal;
  local_118.m_data.object = local_f8.m_data.object;
  local_118.m_data.deleter.m_deviceIface = local_f8.m_data.deleter.m_deviceIface;
  local_f8.m_data.object = (VkCommandBuffer_s *)0x0;
  local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_f8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_f8);
  CommandBuffer::create((Move<vk::VkCommandBuffer_s_*> *)&local_a8,&env,&res,&params_local);
  local_f8.m_data.deleter.m_device = local_a8.m_data.deleter.m_device;
  local_f8.m_data.deleter.m_pool.m_internal = local_a8.m_data.deleter.m_pool.m_internal;
  local_f8.m_data.object = local_a8.m_data.object;
  local_f8.m_data.deleter.m_deviceIface = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object = (VkCommandBuffer_s *)0x0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_a8);
  CommandBuffer::create((Move<vk::VkCommandBuffer_s_*> *)&local_48,&env,&res,&params_local);
  local_a8.m_data.deleter.m_device = local_48.m_data.deleter.m_device;
  local_a8.m_data.deleter.m_pool.m_internal = local_48.m_data.deleter.m_pool.m_internal;
  local_a8.m_data.object = local_48.m_data.object;
  local_a8.m_data.deleter.m_deviceIface = local_48.m_data.deleter.m_deviceIface;
  local_48.m_data.object = (VkCommandBuffer_s *)0x0;
  local_48.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_48.m_data.deleter.m_device = (VkDevice)0x0;
  local_48.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_48);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_a8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_f8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_118);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Ok",(allocator<char> *)&local_118);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            (&res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}